

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall
ON_Line::GetTightBoundingBox(ON_Line *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ON_3dPoint *P_00;
  ON_3dPoint P;
  ON_3dPoint local_68;
  ON_3dPoint local_48;
  
  P_00 = &local_68;
  uVar2 = (uint)CONCAT71(in_register_00000011,bGrowBox);
  if (uVar2 != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    uVar2 = (uint)(bVar1 && bGrowBox);
  }
  if (xform != (ON_Xform *)0x0) {
    bVar1 = ON_Xform::IsIdentity(xform,0.0);
    if (!bVar1) {
      ON_Xform::operator*(&local_68,xform,&this->from);
      ON_BoundingBox::Set(tight_bbox,&local_68,uVar2 & 0xff);
      ON_Xform::operator*(&local_48,xform,&this->to);
      local_68.z = local_48.z;
      local_68.x = local_48.x;
      local_68.y = local_48.y;
      goto LAB_003d2c6f;
    }
  }
  ON_BoundingBox::Set(tight_bbox,&this->from,uVar2 & 0xff);
  P_00 = &this->to;
LAB_003d2c6f:
  ON_BoundingBox::Set(tight_bbox,P_00,1);
  return true;
}

Assistant:

bool ON_Line::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPoint P = (*xform)*from;
    tight_bbox.Set(P,bGrowBox);
    bGrowBox = true;
    P = (*xform)*to;
    tight_bbox.Set(P,bGrowBox);
  }
  else
  {
    tight_bbox.Set(from,bGrowBox);
    bGrowBox = true;
    tight_bbox.Set(to,bGrowBox);
  }

  return (0!=bGrowBox);
}